

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

void __thiscall cfd::core::TapBranch::AddBranch(TapBranch *this,SchnorrPubkey *pubkey)

{
  ByteData256 local_30;
  SchnorrPubkey *local_18;
  SchnorrPubkey *pubkey_local;
  TapBranch *this_local;
  
  local_18 = pubkey;
  pubkey_local = (SchnorrPubkey *)this;
  SchnorrPubkey::GetByteData256(&local_30,pubkey);
  (*this->_vptr_TapBranch[3])(this,&local_30);
  ByteData256::~ByteData256(&local_30);
  return;
}

Assistant:

void TapBranch::AddBranch(const SchnorrPubkey& pubkey) {
  AddBranch(pubkey.GetByteData256());
}